

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O0

void XCryptionCommon::append(ByteList *ioTargetList,ByteList *inSource)

{
  bool bVar1;
  reference __x;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  ByteList *inSource_local;
  ByteList *ioTargetList_local;
  
  it._M_node = (_List_node_base *)inSource;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::begin(inSource);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::end(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    __x = std::_List_const_iterator<unsigned_char>::operator*(&local_20);
    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::push_back(ioTargetList,__x);
    std::_List_const_iterator<unsigned_char>::operator++(&local_20);
  }
  return;
}

Assistant:

void XCryptionCommon::append(ByteList& ioTargetList, const ByteList& inSource) {
	ByteList::const_iterator it = inSource.begin();

	for (; it != inSource.end(); ++it)
		ioTargetList.push_back(*it);
}